

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

CPAccessResult ctr_el0_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = env->features;
  uVar4 = (uint)uVar1;
  if ((uVar4 >> 9 & 1) == 0) {
    if (env->aarch64 != 0) {
      uVar3 = env->pstate >> 2 & 3;
      if (uVar3 < 2) goto LAB_00612846;
LAB_00612879:
      if ((env->pstate & 8) != 0) {
        return CP_ACCESS_OK;
      }
      goto LAB_00612942;
    }
    uVar3 = env->uncached_cpsr & 0x1f;
    if ((uVar3 == 0x1a) || (uVar3 == 0x16)) goto LAB_006128ff;
    if (uVar3 == 0x10) {
      uVar2 = arm_hcr_el2_eff_aarch64(env);
      goto LAB_0061288b;
    }
    if ((uVar1 >> 0x21 & 1) == 0) {
LAB_006127fc:
      uVar2 = arm_hcr_el2_eff_aarch64(env);
      goto LAB_00612852;
    }
    if (uVar3 == 0x16) {
      if ((uVar4 >> 0x1c & 1) != 0) goto LAB_006127fc;
    }
    else if ((uVar1 & 0x10000000) != 0 || ((env->cp15).scr_el3 & 1) != 0) goto LAB_006127fc;
  }
  else {
    if ((env->v7m).exception != 0) goto LAB_006127fc;
    uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
LAB_00612846:
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if (uVar3 == 0) {
LAB_0061288b:
      if ((~uVar2 & 0x408000000) != 0) {
        if ((undefined1  [32])((undefined1  [32])(env->cp15).field_2 & (undefined1  [32])0x8000) ==
            (undefined1  [32])0x0) {
          return CP_ACCESS_TRAP;
        }
        goto LAB_00612852;
      }
      if ((*(byte *)((long)&(env->cp15).field_2 + 0x11) & 0x80) == 0) {
        return CP_ACCESS_TRAP_EL2;
      }
    }
    else {
LAB_00612852:
      if (((uint)uVar2 >> 0x11 & 1) != 0) {
        return CP_ACCESS_TRAP_EL2;
      }
    }
    if ((uVar4 >> 9 & 1) != 0) goto LAB_00612942;
    if (env->aarch64 != 0) goto LAB_00612879;
  }
LAB_006128ff:
  uVar3 = env->uncached_cpsr & 0x1f;
  if (uVar3 != 0x10) {
    if (uVar3 == 0x16) {
      return CP_ACCESS_OK;
    }
    if (uVar3 == 0x1a) {
      return CP_ACCESS_OK;
    }
    if ((uVar1 >> 0x21 & 1) != 0) {
      if (uVar3 == 0x16) {
        if ((uVar4 >> 0x1c & 1) == 0) {
          return CP_ACCESS_OK;
        }
      }
      else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) {
        return CP_ACCESS_OK;
      }
    }
  }
LAB_00612942:
  uVar2 = arm_hcr_el2_eff_aarch64(env);
  if (((uint)uVar2 >> 0x11 & 1) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL2;
}

Assistant:

static CPAccessResult ctr_el0_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                     bool isread)
{
    int cur_el = arm_current_el(env);

    if (cur_el < 2) {
        uint64_t hcr = arm_hcr_el2_eff(env);

        if (cur_el == 0) {
            if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
                if (!(env->cp15.sctlr_el[2] & SCTLR_UCT)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            } else {
                if (!(env->cp15.sctlr_el[1] & SCTLR_UCT)) {
                    return CP_ACCESS_TRAP;
                }
                if (hcr & HCR_TID2) {
                    return CP_ACCESS_TRAP_EL2;
                }
            }
        } else if (hcr & HCR_TID2) {
            return CP_ACCESS_TRAP_EL2;
        }
    }

    if (arm_current_el(env) < 2 && arm_hcr_el2_eff(env) & HCR_TID2) {
        return CP_ACCESS_TRAP_EL2;
    }

    return CP_ACCESS_OK;
}